

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::NotifyFree(Recycler *this,char *address,size_t size)

{
  size_t *psVar1;
  bool bVar2;
  
  if (this->recyclerFlagsTable->Verbose == true) {
    bVar2 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar2) {
      Output::Print(L"Sweeping object %p\n",address);
    }
  }
  bVar2 = BinaryFeatureControl::RecyclerTest();
  if ((bVar2) && (this->checkFn != (_func_BOOL_char_ptr_size_t *)0x0)) {
    (*this->checkFn)(address,size);
  }
  RecyclerMemoryTracking::ReportFree(this,address,size);
  if (this->verifyEnabled != false) {
    VerifyCheckPad(this,address,size);
  }
  if (Js::Configuration::Global[0x2c159] == '\0') {
    TrackFree(this,address,size);
  }
  psVar1 = &(this->collectionStats).objectSweptCount;
  *psVar1 = *psVar1 + 1;
  psVar1 = &(this->collectionStats).objectSweptBytes;
  *psVar1 = *psVar1 + size;
  if (this->isForceSweeping == false) {
    psVar1 = &(this->collectionStats).objectSweptFreeListCount;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(this->collectionStats).objectSweptFreeListBytes;
    *psVar1 = *psVar1 + size;
  }
  return;
}

Assistant:

void
Recycler::NotifyFree(__in char *address, size_t size)
{
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("Sweeping object %p\n"), address);

#ifdef RECYCLER_TEST_SUPPORT
    if (BinaryFeatureControl::RecyclerTest())
    {
        if (checkFn != NULL)
            checkFn(address, size);
    }
#endif

#ifdef ENABLE_JS_ETW
    if (EventEnabledJSCRIPT_RECYCLER_FREE_MEMORY())
    {
        AppendFreeMemoryETWRecord(address, (UINT)size);
    }
#endif

    RecyclerMemoryTracking::ReportFree(this, address, size);
    RECYCLER_PERF_COUNTER_DEC(LiveObject);
    RECYCLER_PERF_COUNTER_SUB(LiveObjectSize, size);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, size);

    if (HeapInfo::IsSmallBlockAllocation(HeapInfo::GetAlignedSizeNoCheck(size)))
    {
        RECYCLER_PERF_COUNTER_DEC(SmallHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockLiveObjectSize, size);
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockFreeObjectSize, size);
    }
    else
    {
        RECYCLER_PERF_COUNTER_DEC(LargeHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockLiveObjectSize, size);
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockFreeObjectSize, size);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        VerifyCheckPad(address, size);
    }
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (!CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree(address, size);
    }
#endif

#ifdef RECYCLER_STATS
    collectionStats.objectSweptCount++;
    collectionStats.objectSweptBytes += size;

    if (!isForceSweeping)
    {
        collectionStats.objectSweptFreeListCount++;
        collectionStats.objectSweptFreeListBytes += size;
    }
#endif
}